

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::PrintCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  int iVar2;
  Output OStack_18;
  char *params_local;
  
  params_local = params;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&params_local);
  if (bVar1) {
    Output::Output(&OStack_18,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"usage: ");
    std::operator<<((ostream *)&std::cout,(string *)token::Print_abi_cxx11_);
    Output::~Output(&OStack_18);
    Output::Output(&OStack_18,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Output text representation of the current position.");
    Output::~Output(&OStack_18);
    return;
  }
  iVar2 = (*this->engine->_vptr_ChessEngine[8])();
  if ((char)iVar2 == '\0') {
    (*this->engine->_vptr_ChessEngine[7])();
  }
  (*this->engine->_vptr_ChessEngine[0xc])();
  return;
}

Assistant:

void UCIAdapter::PrintCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Print;
    Output() << "Output text representation of the current position.";
    return;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
  }
  engine->PrintBoard();
}